

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBuilderUtil.cpp
# Opt level: O2

Move<vk::Handle<(vk::HandleType)19>_> * __thiscall
vk::DescriptorSetLayoutBuilder::build
          (Move<vk::Handle<(vk::HandleType)19>_> *__return_storage_ptr__,
          DescriptorSetLayoutBuilder *this,DeviceInterface *vk,VkDevice device,
          VkDescriptorSetLayoutCreateFlags extraFlags)

{
  pointer pIVar1;
  pointer pIVar2;
  pointer pHVar3;
  ulong uVar4;
  vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  bindings;
  VkDescriptorSetLayoutCreateInfo createInfo;
  
  std::vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>::
  vector(&bindings,&this->m_bindings);
  pIVar1 = (this->m_immutableSamplerInfos).
           super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar2 = (this->m_immutableSamplerInfos).
           super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pHVar3 = (this->m_immutableSamplers).
           super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar4 = 0; uVar4 < (ulong)((long)pIVar2 - (long)pIVar1 >> 3); uVar4 = uVar4 + 1) {
    bindings.
    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
    ._M_impl.super__Vector_impl_data._M_start[pIVar1[uVar4].bindingIndex].pImmutableSamplers =
         pHVar3 + pIVar1[uVar4].samplerBaseIndex;
  }
  createInfo.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
  createInfo.pNext = (void *)0x0;
  createInfo.pBindings =
       bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if ((long)bindings.
            super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)bindings.
            super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
            ._M_impl.super__Vector_impl_data._M_start == 0) {
    createInfo.pBindings = (pointer)0x0;
  }
  createInfo.bindingCount =
       (deUint32)
       (((long)bindings.
               super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)bindings.
              super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  createInfo.flags = extraFlags;
  createDescriptorSetLayout
            (__return_storage_ptr__,vk,device,&createInfo,(VkAllocationCallbacks *)0x0);
  std::
  _Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ::~_Vector_base(&bindings.
                   super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                 );
  return __return_storage_ptr__;
}

Assistant:

Move<VkDescriptorSetLayout> DescriptorSetLayoutBuilder::build (const DeviceInterface& vk, VkDevice device, VkDescriptorSetLayoutCreateFlags extraFlags) const
{
	// Create new layout bindings with pImmutableSamplers updated
	std::vector<VkDescriptorSetLayoutBinding>	bindings	= m_bindings;

	for (size_t samplerInfoNdx = 0; samplerInfoNdx < m_immutableSamplerInfos.size(); samplerInfoNdx++)
	{
		const ImmutableSamplerInfo&	samplerInfo	= m_immutableSamplerInfos[samplerInfoNdx];

		bindings[samplerInfo.bindingIndex].pImmutableSamplers	= &m_immutableSamplers[samplerInfo.samplerBaseIndex];
	}

	const VkDescriptorSetLayoutCreateInfo		createInfo	=
	{
		VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO,
		DE_NULL,
		(VkDescriptorSetLayoutCreateFlags)extraFlags,			// flags
		(deUint32)bindings.size(),								// bindingCount
		(bindings.empty()) ? (DE_NULL) : (bindings.data()),		// pBinding
	};

	return createDescriptorSetLayout(vk, device, &createInfo);
}